

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O3

int main(int argc,char **argv)

{
  uint *__src;
  ostream *poVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> ESI;
  Array_Data_Symbol testing_symbol;
  Array_Data_Symbol source;
  LT_Encoding encoder;
  R10_Decoder decoder;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_4e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_4d0;
  Array_Data_Symbol local_4b8;
  Array_Data_Symbol local_440;
  undefined1 local_3c8 [8];
  pointer pVStack_3c0;
  pointer local_3b8;
  pointer local_390;
  pointer local_388;
  Array_Data_Symbol local_348;
  LT_Encoding local_2d0;
  undefined1 local_228 [520];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Raptor Codes Testing !",0x16);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  Array_Data_Symbol::Array_Data_Symbol(&local_440,0x400,1);
  if (local_440.K != 0) {
    lVar2 = 0;
    iVar4 = 0;
    uVar6 = 0;
    do {
      if ((int)((uVar6 & 0xffffffff) / 3) * 3 + iVar4 != 0) {
        **(undefined1 **)
          ((long)&((local_440.symbol.
                    super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>._M_impl.
                    super__Vector_impl_data._M_start)->s).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar2) = 1;
      }
      uVar6 = uVar6 + 1;
      iVar4 = iVar4 + -1;
      lVar2 = lVar2 + 0x20;
    } while (uVar6 < local_440.K);
  }
  LT_Encoding::LT_Encoding(&local_2d0,&local_440);
  Array_Data_Symbol::Array_Data_Symbol(&local_4b8,local_440.K,1);
  local_4e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_4e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_4e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  if (local_440.K != 0xfffffffd) {
    uVar3 = 0;
    do {
      if (local_4e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_4e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        local_228._0_4_ = uVar3;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&local_4e8,
                   (iterator)
                   local_4e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish,(uint *)local_228);
      }
      else {
        *local_4e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = uVar3;
        local_4e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_4e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      local_228._0_4_ = uVar3;
      if (local_4b8.ESIs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_4b8.ESIs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&local_4b8.ESIs,
                   (iterator)
                   local_4b8.ESIs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(uint *)local_228);
      }
      else {
        *local_4b8.ESIs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = uVar3;
        local_4b8.ESIs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_4b8.ESIs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < local_440.K + 3);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_4d0,&local_4e8);
  LT_Encoding::LTEnc_Generate
            ((vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_> *)local_3c8,&local_2d0,
             &local_4d0);
  local_228._16_8_ =
       local_4b8.symbol.super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_228._8_8_ =
       local_4b8.symbol.super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_228._0_8_ =
       local_4b8.symbol.super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_4b8.symbol.super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_3b8;
  local_4b8.symbol.super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_3c8;
  local_4b8.symbol.super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>._M_impl.
  super__Vector_impl_data._M_finish = pVStack_3c0;
  local_3c8 = (undefined1  [8])0x0;
  pVStack_3c0 = (pointer)0x0;
  local_3b8 = (pointer)0x0;
  std::vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>::~vector
            ((vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_> *)local_228);
  std::vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>::~vector
            ((vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_> *)local_3c8);
  if (local_4d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_4d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_4d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  R10_Decoder::R10_Decoder((R10_Decoder *)local_228,local_440.K,1);
  std::vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>::_M_erase
            (&local_4b8.symbol,
             local_4b8.symbol.super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>.
             _M_impl.super__Vector_impl_data._M_start + 3);
  __src = local_4b8.ESIs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start + 4;
  if (__src != local_4b8.ESIs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish) {
    memmove(local_4b8.ESIs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start + 3,__src,
            (long)local_4b8.ESIs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)__src);
  }
  local_4b8.ESIs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_4b8.ESIs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish + -1;
  local_348.sym_len = local_4b8.sym_len;
  local_348.X = local_4b8.X;
  local_348.S = local_4b8.S;
  local_348.H = local_4b8.H;
  local_348.HP = local_4b8.HP;
  local_348.L = local_4b8.L;
  local_348.LP = local_4b8.LP;
  local_348.K = local_4b8.K;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_348.ESIs,&local_4b8.ESIs);
  std::vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>::vector
            (&local_348.symbol,&local_4b8.symbol);
  local_348._HP = local_4b8._HP;
  local_348._L = local_4b8._L;
  local_348._LP = local_4b8._LP;
  local_348._sym_len = local_4b8._sym_len;
  local_348._K = local_4b8._K;
  local_348._X = local_4b8._X;
  local_348._S = local_4b8._S;
  local_348._H = local_4b8._H;
  R10_Decoder::Get_Source_Symbol
            ((Array_Data_Symbol *)local_3c8,(R10_Decoder *)local_228,&local_348,local_440.K + 2);
  Array_Data_Symbol::~Array_Data_Symbol(&local_348);
  if ((long)local_388 - (long)local_390 != 0) {
    lVar2 = (long)local_388 - (long)local_390 >> 5;
    lVar2 = lVar2 + (ulong)(lVar2 == 0);
    lVar5 = 0;
    do {
      if ((bool)**(char **)((long)&(local_390->s).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar5) !=
          (**(char **)((long)&((local_440.symbol.
                                super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>
                                ._M_impl.super__Vector_impl_data._M_start)->s).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar5) != '\0')) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"decode fail!",0xc)
        ;
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
        std::ostream::put(' ');
        iVar4 = -1;
        std::ostream::flush();
        goto LAB_00109b71;
      }
      lVar5 = lVar5 + 0x20;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"decode successfully!",0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"total symbols: ",0xf);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  redundancy rate: ",0x13);
  poVar1 = std::ostream::_M_insert<double>(0.0029296875);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  iVar4 = 0;
  std::ostream::flush();
LAB_00109b71:
  Array_Data_Symbol::~Array_Data_Symbol((Array_Data_Symbol *)local_3c8);
  R10_Decoder::~R10_Decoder((R10_Decoder *)local_228);
  if (local_4e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_4e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_4e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  Array_Data_Symbol::~Array_Data_Symbol(&local_4b8);
  LT_Encoding::~LT_Encoding(&local_2d0);
  Array_Data_Symbol::~Array_Data_Symbol(&local_440);
  return iVar4;
}

Assistant:

int main(int argc, char const *argv[])
{
	std::cout << "Raptor Codes Testing !" << std::endl;	


    const int SYMBOL_LEN = 1;
    const int SYMBOL_SIZE = 1024;
    const int overhead = 3;


	class Array_Data_Symbol testing_symbol(SYMBOL_SIZE, SYMBOL_LEN);

	for (int i = 0; i < testing_symbol.K; ++i)
	{
		// if (i%2)
		// {
		// 	a.symbol[i].s[0] = 1;
		// }
		if (i%3)
		{
			testing_symbol.symbol[i].s[0] = 1;
		}		
	}




    class LT_Encoding encoder(&testing_symbol);


   	class Array_Data_Symbol D(testing_symbol.K, SYMBOL_LEN);

    std::vector<uint32_t> ESI;

    for (int i = 0; i < testing_symbol.K + overhead; ++i)
    {
    	ESI.push_back(i);
    	D.ESIs.push_back(i);
    }




    // for (int i = 0; i < ESI.size(); ++i)
    // {
    // 	printf("ESI: %d\n", ESI[i]);
    // }

	//printf("ESI: %d\n", ESI.size());

    D.symbol = encoder.LTEnc_Generate(ESI);


	class R10_Decoder decoder(testing_symbol.K, SYMBOL_LEN);

	// class Array_Data_Symbol C = decoder.Get_Inter_Symbols(D, testing_symbol.K);


 //    std::cout << "testing_symbol: " << std::endl;
 //    for (int i = 0; i < testing_symbol.K; ++i)
 //    {
 //        printf("%d ", testing_symbol.symbol[i].s[0]);
 //    }
 //    std::cout << std::endl;

 //     printf("D: \n");

 //    for (int i = 0; i < D.symbol.size(); ++i)
 //    {
 //        printf("%d ", D.symbol[i].s[0]);
 //    }
 //    printf("\n");

	// printf("C: \n");

	// for (int i = 0; i < C.symbol.size(); ++i)
	// {
	// 	printf("%d ", C.symbol[i].s[0]);
	// }
	// printf("\n");


    // decoder.Inter_Symbols_Decoding(C);

    // drop some symbols for testing
     int loss = 1;
    D.symbol.erase(D.symbol.begin() + 3);
    D.ESIs.erase(D.ESIs.begin() + 3);



   class Array_Data_Symbol source = decoder.Get_Source_Symbol(D, testing_symbol.K + overhead - loss);


    // printf("Source Symbol: \n");

    // for (int i = 0; i < source.symbol.size(); ++i)
    // {
    //     printf("%d ", source.symbol[i].s[0]);
    // }
    // printf("\n");


    // std::cout << "Testing Symbol: " << std::endl;
    // for (int i = 0; i < testing_symbol.K; ++i)
    // {
    //     printf("%d ", testing_symbol.symbol[i].s[0]);
    // }
    // std::cout << std::endl;


   for (int i = 0; i < source.symbol.size(); ++i)
   {
        if (source.symbol[i].s[0] ^ testing_symbol.symbol[i].s[0] != 0)
        {

             std::cout << "decode fail!" << std::endl;
             return -1;

        }

   }


    std::cout << "decode successfully!" << std::endl;
    std::cout <<  "total symbols: " << source.K <<"  redundancy rate: " <<  (float)overhead / (float)SYMBOL_SIZE <<std::endl;


	return 0;
}